

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanCommandBuffer.hpp
# Opt level: O2

void __thiscall
VulkanUtilities::VulkanCommandBuffer::BindComputePipeline
          (VulkanCommandBuffer *this,VkPipeline ComputePipeline)

{
  char (*in_RCX) [32];
  string msg;
  
  if (this->m_VkCmdBuffer == (VkCommandBuffer)0x0) {
    Diligent::FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkCmdBuffer != VK_NULL_HANDLE",in_RCX);
    Diligent::DebugAssertionFailed
              (msg._M_dataplus._M_p,"BindComputePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/VulkanUtilities/VulkanCommandBuffer.hpp"
               ,0x197);
    std::__cxx11::string::~string((string *)&msg);
  }
  if ((this->m_State).ComputePipeline != ComputePipeline) {
    (*vkCmdBindPipeline)(this->m_VkCmdBuffer,VK_PIPELINE_BIND_POINT_COMPUTE,ComputePipeline);
    (this->m_State).ComputePipeline = ComputePipeline;
  }
  return;
}

Assistant:

__forceinline void BindComputePipeline(VkPipeline ComputePipeline)
    {
        // 9.8
        VERIFY_EXPR(m_VkCmdBuffer != VK_NULL_HANDLE);
        if (m_State.ComputePipeline != ComputePipeline)
        {
            vkCmdBindPipeline(m_VkCmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, ComputePipeline);
            m_State.ComputePipeline = ComputePipeline;
        }
    }